

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O3

Status __thiscall
flatbuffers::anon_unknown_10::TsCodeGenerator::GenerateMakeRule
          (TsCodeGenerator *this,Parser *parser,string *path,string *filename,string *output)

{
  long *plVar1;
  _Rb_tree_node_base *p_Var2;
  long *plVar3;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  included_files;
  string filebase;
  TsGenerator generator;
  long *local_300;
  long local_2f8;
  long local_2f0;
  long lStack_2e8;
  string *local_2e0;
  undefined1 local_2d8 [32];
  undefined1 local_2b8 [48];
  string local_288;
  undefined1 local_268 [128];
  undefined **local_1e8;
  Config local_1e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  _Base_ptr local_50;
  
  StripExtension((string *)local_268,filename);
  StripPath(&local_288,(string *)local_268);
  if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
    operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
  }
  ts::TsGenerator::TsGenerator((TsGenerator *)local_268,parser,path,filename);
  BaseGenerator::GeneratedFileName
            ((string *)local_2b8,(BaseGenerator *)local_268,path,&local_288,&parser->opts);
  plVar1 = (long *)std::__cxx11::string::append(local_2b8);
  local_300 = &local_2f0;
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_2f0 = *plVar3;
    lStack_2e8 = plVar1[3];
  }
  else {
    local_2f0 = *plVar3;
    local_300 = (long *)*plVar1;
  }
  local_2f8 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  local_2e0 = output;
  if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
    operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
  }
  Parser::GetIncludedFilesRecursive
            ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_2b8,parser,filename);
  if ((_Rb_tree_node_base *)local_2b8._24_8_ != (_Rb_tree_node_base *)(local_2b8 + 8)) {
    p_Var2 = (_Rb_tree_node_base *)local_2b8._24_8_;
    do {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
                     " ",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var2 + 1));
      parser = (Parser *)local_2d8._0_8_;
      std::__cxx11::string::_M_append((char *)&local_300,local_2d8._0_8_);
      if ((Parser *)local_2d8._0_8_ != (Parser *)(local_2d8 + 0x10)) {
        parser = (Parser *)(local_2d8._16_8_ + 1);
        operator_delete((void *)local_2d8._0_8_,(ulong)parser);
      }
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
    } while (p_Var2 != (_Rb_tree_node_base *)(local_2b8 + 8));
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2b8);
  local_268._0_8_ = &PTR_generate_003e9938;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition>_>_>
              *)local_50,(_Link_type)parser);
  local_1e8 = &PTR__Namer_003e8dd0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_90);
  Namer::Config::~Config(&local_1e0);
  BaseGenerator::~BaseGenerator((BaseGenerator *)local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::operator=((string *)local_2e0,(string *)&local_300);
  if (local_300 != &local_2f0) {
    operator_delete(local_300,local_2f0 + 1);
  }
  return OK;
}

Assistant:

Status GenerateMakeRule(const Parser &parser, const std::string &path,
                          const std::string &filename,
                          std::string &output) override {
    output = TSMakeRule(parser, path, filename);
    return Status::OK;
  }